

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void free_macro_call(macro_call_t mc)

{
  VARR_token_arr_t *pVVar1;
  size_t sVar2;
  long lVar3;
  undefined8 uVar4;
  ulong *puVar5;
  FILE *__stream;
  macro_call_t pmVar6;
  macro_call_t pmVar7;
  ulong uVar8;
  size_t *psVar9;
  
  pmVar6 = (macro_call_t)mc->repl_buffer;
  pmVar7 = mc;
  if ((pmVar6 != (macro_call_t)0x0) &&
     (pmVar7 = *(macro_call_t *)&(pmVar6->pos).lno, pmVar7 != (macro_call_t)0x0)) {
    free(pmVar7);
    free(pmVar6);
    mc->repl_buffer = (VARR_token_t *)0x0;
    if (mc->args == (VARR_token_arr_t *)0x0) {
LAB_0017c64b:
      free(mc);
      return;
    }
    while (pVVar1 = mc->args, pVVar1 != (VARR_token_arr_t *)0x0) {
      sVar2 = pVVar1->els_num;
      pmVar7 = (macro_call_t)pVVar1->varr;
      if (sVar2 == 0) {
        if (pmVar7 == (macro_call_t)0x0) goto LAB_0017c66e;
        free(pmVar7);
        free(pVVar1);
        mc->args = (VARR_token_arr_t *)0x0;
        goto LAB_0017c64b;
      }
      if (pmVar7 == (macro_call_t)0x0) goto LAB_0017c664;
      pVVar1->els_num = sVar2 - 1;
      pmVar6 = *(macro_call_t *)((long)pmVar7 + sVar2 * 8 + -8);
      if ((pmVar6 == (macro_call_t)0x0) ||
         (pmVar7 = *(macro_call_t *)&(pmVar6->pos).lno, pmVar7 == (macro_call_t)0x0)) {
        pmVar6 = pmVar7;
        free_macro_call_cold_1();
        break;
      }
      free(pmVar7);
      free(pmVar6);
    }
    free_macro_call_cold_4();
    pmVar7 = pmVar6;
LAB_0017c664:
    free_macro_call_cold_2();
  }
  free_macro_call_cold_5();
LAB_0017c66e:
  free_macro_call_cold_3();
  if (pmVar7 != (macro_call_t)0x0) {
    return;
  }
  VARR_token_arr_tlength_cold_1();
  pVVar1 = pmVar7->args;
  pmVar6 = pmVar7;
  if ((pVVar1 != (VARR_token_arr_t *)0x0) &&
     (pmVar6 = (macro_call_t)pVVar1->varr, pmVar6 != (macro_call_t)0x0)) {
    free(pmVar6);
    free(pVVar1);
    pmVar7->args = (VARR_token_arr_t *)0x0;
    free(pmVar7);
    return;
  }
  free_stream_cold_1();
  if (pmVar6 != (macro_call_t)0x0) {
    return;
  }
  VARR_stream_tlength_cold_1();
  if (((pmVar6 != (macro_call_t)0x0) &&
      (lVar3._0_4_ = (pmVar6->pos).lno, lVar3._4_4_ = (pmVar6->pos).ln_pos, lVar3 != 0)) &&
     (pmVar6->macro != (macro_t)0x0)) {
    pmVar6->macro = (macro_t)&pmVar6->macro[-1].field_0x1f;
    return;
  }
  VARR_stream_tpop_cold_1();
  pmVar7 = pmVar6;
  if (pmVar6->repl_buffer != (VARR_token_t *)0x0) {
    if (pmVar6[1].macro == (macro_t)0x0) goto LAB_0017c79d;
    if (*(int *)&(pmVar6->pos).fname != 0) {
      uVar4._0_4_ = (pmVar6->pos).lno;
      uVar4._4_4_ = (pmVar6->pos).ln_pos;
      psVar9 = &(pmVar6[1].macro)->replacement->size;
      uVar8 = 0;
      do {
        if ((int)((VARR_token_t *)(psVar9 + -1))->els_num != 0) {
          pmVar7 = (macro_call_t)*psVar9;
          (*(code *)pmVar6->repl_buffer)(pmVar7,uVar4);
        }
        uVar8 = uVar8 + 1;
        psVar9 = psVar9 + 2;
      } while (uVar8 < *(uint *)&(pmVar6->pos).fname);
    }
  }
  *(undefined4 *)&(pmVar6->pos).fname = 0;
  pmVar6->macro = (macro_t)0x0;
  puVar5 = (ulong *)pmVar6[1].pos.fname;
  if (puVar5 != (ulong *)0x0) {
    if ((int)*puVar5 != 0) {
      memset((void *)puVar5[2],0xff,(*puVar5 & 0xffffffff) << 2);
      return;
    }
    return;
  }
  HTAB_case_t_clear_cold_2();
LAB_0017c79d:
  HTAB_case_t_clear_cold_1();
  __stream = *(FILE **)(pmVar7->pos).fname;
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"%s\n");
  }
  longjmp((__jmp_buf_tag *)&(pmVar7->pos).lno,1);
}

Assistant:

static void free_macro_call (macro_call_t mc) {
  VARR_DESTROY (token_t, mc->repl_buffer);
  if (mc->args != NULL) {
    while (VARR_LENGTH (token_arr_t, mc->args) != 0) {
      VARR (token_t) *arg = VARR_POP (token_arr_t, mc->args);
      VARR_DESTROY (token_t, arg);
    }
    VARR_DESTROY (token_arr_t, mc->args);
  }
  free (mc);
}